

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::AOIntegrator::Li
          (AOIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,SamplerHandle *sampler
          ,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  PrimitiveHandle *this_00;
  Float tMax;
  undefined1 auVar1 [32];
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  DebugMLTSampler *this_01;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  undefined1 auVar12 [48];
  undefined1 auVar10 [64];
  float fVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar14;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar26 [56];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar25 [64];
  float fVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar31 [56];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  SampledSpectrum SVar39;
  anon_class_8_1_5ef94505 samp;
  BSDF bsdf;
  Tuple3<pbrt::Vector3,_float> local_398;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBSpectrum,pbrt::RGBReflectanceSpectrum,pbrt::BlackbodySpectrum>
  *local_320;
  undefined1 (*local_318) [32];
  undefined1 (*local_310) [32];
  anon_class_8_1_5ef94505 local_308;
  ScratchBuffer *local_300;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_2f8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  anon_struct_8_0_00000001_for___align local_2b8;
  float fStack_2b0;
  float local_2ac;
  undefined1 auStack_2a8 [12];
  MediumHandle local_298;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_288;
  undefined8 local_188;
  undefined1 local_178 [152];
  Tuple3<pbrt::Vector3,_float> aTStack_e0 [2];
  Tuple3<pbrt::Normal3,_float> TStack_c8;
  int iStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [40];
  Float local_80;
  char local_78;
  BSDF local_70;
  undefined1 auVar8 [64];
  undefined1 auVar11 [64];
  undefined1 auVar24 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 auVar30 [64];
  
  this_00 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_78 = '\0';
  local_318 = (undefined1 (*) [32])local_a8;
  local_310 = (undefined1 (*) [32])(local_288.__data + 0xd0);
  local_320 = (TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBSpectrum,pbrt::RGBReflectanceSpectrum,pbrt::BlackbodySpectrum>
               *)&this->illuminant;
  local_308.lambda = lambda;
  local_300 = scratchBuffer;
  do {
    *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
    if (((this_00->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
      local_188 = 0;
      local_288._64_8_ = 0;
      local_288._136_8_ = 0;
      local_288._144_8_ = 0;
      local_288._152_8_ = 0;
      local_288._160_8_ = 0;
      local_288._168_8_ = 0;
      local_288._176_8_ = 0;
      local_288._184_8_ = 0;
      local_288._80_48_ = (undefined1  [48])0x0;
      local_288._0_64_ = in_ZmmResult;
      local_288._72_8_ = local_288._136_8_;
      local_288._128_8_ = local_288._64_8_;
      local_288._192_64_ = in_ZmmResult;
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_288.__align,this_00,&ray->super_Ray,
                 INFINITY);
    }
    if (local_78 == '\x01') {
      local_78 = '\0';
    }
    if ((char)local_188 == '\x01') {
      in_ZmmResult._48_8_ = local_288._128_8_;
      in_ZmmResult._0_48_ = local_288._80_48_;
      in_ZmmResult._56_8_ = local_288._136_8_;
      local_178._64_8_ = local_288._64_8_;
      local_178._72_8_ = local_288._72_8_;
      local_178._0_8_ = local_288.__align;
      local_178._8_8_ = local_288._8_8_;
      local_178._16_8_ = local_288._16_8_;
      local_178._24_8_ = local_288._24_8_;
      local_178._32_8_ = local_288._32_8_;
      local_178._40_8_ = local_288._40_8_;
      local_178._48_8_ = local_288._48_8_;
      local_178._56_8_ = local_288._56_8_;
      auVar1 = *local_310;
      local_178._144_8_ = local_288._144_8_;
      aTStack_e0[0].x = (float)local_288._152_4_;
      aTStack_e0[0].y = (float)local_288._156_4_;
      aTStack_e0[0].z = (float)local_288._160_4_;
      aTStack_e0[1].x = (float)local_288._164_4_;
      aTStack_e0[1].y = (float)local_288._168_4_;
      aTStack_e0[1].z = (float)local_288._172_4_;
      TStack_c8.x = (float)local_288._176_4_;
      TStack_c8.y = (float)local_288._180_4_;
      TStack_c8.z = (float)local_288._184_4_;
      iStack_bc = local_288._188_4_;
      local_b8 = local_288._192_16_;
      *(undefined8 *)local_318[1] = *(undefined8 *)local_310[1];
      *local_318 = auVar1;
      local_80 = (Float)local_288._248_4_;
      local_78 = '\x01';
      local_178._80_64_ = in_ZmmResult;
    }
    else if (local_78 == '\0') {
      uVar28 = 0;
      uVar14 = 0;
      goto LAB_00450d19;
    }
    local_2f0.bits =
         (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_2f8.bits =
         (sampler->
         super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    SurfaceInteraction::GetBSDF
              (&local_70,(SurfaceInteraction *)local_178,ray,lambda,(CameraHandle *)&local_2f0,
               local_300,(SamplerHandle *)&local_2f8);
    auVar12 = in_ZmmResult._16_48_;
    if (((ulong)local_70.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                .bits & 0xffffffffffff) == 0) {
      if (local_78 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
      }
      SurfaceInteraction::SkipIntersection((SurfaceInteraction *)local_178,ray,local_80);
      iVar5 = 2;
    }
    else {
      fVar13 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_348._8_8_ = 0;
      local_348._0_8_ = local_178._40_8_;
      auVar38 = vmovshdup_avx(local_348);
      local_338 = ZEXT416((uint)local_178._48_4_);
      auVar29 = ZEXT416((uint)((float)local_178._48_4_ * -fVar13));
      auVar38 = vfnmadd132ss_fma(auVar38,auVar29,
                                 ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>
                                               .y));
      auVar29 = vfnmsub213ss_fma(ZEXT416((uint)fVar13),local_338,auVar29);
      auVar38 = vfnmadd132ss_fma(local_348,ZEXT416((uint)(auVar38._0_4_ + auVar29._0_4_)),
                                 ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>
                                               .x));
      local_358._0_4_ = auVar38._0_4_;
      if (auVar38._0_4_ < 0.0) {
        local_348._0_8_ = local_178._40_8_ ^ 0x8000000080000000;
        local_348._8_4_ = 0x80000000;
        local_348._12_4_ = 0x80000000;
      }
      local_398.x = 0.0;
      local_398.y = 0.0;
      local_398.z = 0.0;
      uVar2 = (sampler->
              super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
      uVar4 = (uint)(ushort)(uVar2 >> 0x30);
      if (uVar2 >> 0x30 < 5) {
        if (uVar4 < 3) {
          if (uVar4 == 2) {
            auVar17._0_8_ =
                 PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar2 & 0xffffffffffff));
            auVar17._8_56_ = extraout_var_00;
            auVar38 = auVar17._0_16_;
          }
          else {
            auVar21._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar2 & 0xffffffffffff));
            auVar21._8_56_ = extraout_var_04;
            auVar38 = auVar21._0_16_;
          }
        }
        else if ((uVar4 & 6) == 2) {
          auVar19._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar2 & 0xffffffffffff));
          auVar19._8_56_ = extraout_var_02;
          auVar38 = auVar19._0_16_;
        }
        else {
          auVar23._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar2 & 0xffffffffffff));
          auVar23._8_56_ = extraout_var_06;
          auVar38 = auVar23._0_16_;
        }
      }
      else {
        uVar4 = uVar4 - 4;
        if (uVar4 < 3) {
          if (uVar4 == 2) {
            auVar18._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar2 & 0xffffffffffff));
            auVar18._8_56_ = extraout_var_01;
            auVar38 = auVar18._0_16_;
          }
          else {
            auVar22._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar2 & 0xffffffffffff));
            auVar22._8_56_ = extraout_var_05;
            auVar38 = auVar22._0_16_;
          }
        }
        else {
          this_01 = (DebugMLTSampler *)(uVar2 & 0xffffffffffff);
          if ((uVar4 & 0x7ffffffe) == 2) {
            auVar20._0_8_ = MLTSampler::Get2D((MLTSampler *)this_01);
            auVar20._8_56_ = extraout_var_03;
            auVar38 = auVar20._0_16_;
          }
          else {
            local_388._0_4_ = DebugMLTSampler::Get1D(this_01);
            local_388._4_4_ = extraout_XMM0_Db;
            local_388._8_4_ = extraout_XMM0_Dc;
            local_388._12_4_ = extraout_XMM0_Dd;
            auVar25._0_4_ = DebugMLTSampler::Get1D(this_01);
            auVar25._4_60_ = extraout_var;
            auVar38 = vinsertps_avx(local_388,auVar25._0_16_,0x10);
          }
        }
      }
      lambda = local_308.lambda;
      auVar29 = ZEXT816(0) << 0x40;
      if (this->cosSample == true) {
        auVar15._0_4_ = auVar38._0_4_ + auVar38._0_4_;
        auVar15._4_4_ = auVar38._4_4_ + auVar38._4_4_;
        auVar15._8_4_ = auVar38._8_4_ + auVar38._8_4_;
        auVar15._12_4_ = auVar38._12_4_ + auVar38._12_4_;
        auVar38._8_4_ = 0xbf800000;
        auVar38._0_8_ = 0xbf800000bf800000;
        auVar38._12_4_ = 0xbf800000;
        in_ZmmResult._0_16_ = vaddps_avx512vl(auVar15,auVar38);
        in_ZmmResult._16_48_ = auVar12;
        fVar33 = in_ZmmResult._0_4_;
        auVar15 = vmovshdup_avx(in_ZmmResult._0_16_);
        fVar13 = auVar15._0_4_;
        if (fVar33 == 0.0) {
          auVar38 = ZEXT816(0) << 0x40;
          if ((fVar13 != 0.0) || (NAN(fVar13))) goto LAB_0045097b;
        }
        else {
LAB_0045097b:
          auVar29._8_4_ = 0x7fffffff;
          auVar29._0_8_ = 0x7fffffff7fffffff;
          auVar29._12_4_ = 0x7fffffff;
          auVar6 = vandps_avx512vl(in_ZmmResult._0_16_,auVar29);
          auVar16._0_4_ = fVar33 / fVar13;
          auVar16._4_12_ = in_ZmmResult._4_12_;
          auVar38 = vshufps_avx(auVar6,auVar6,0xf5);
          auVar29 = vfmadd132ss_fma(auVar16,SUB6416(ZEXT464(0x3fc90fdb),0),ZEXT416(0xbf490fdb));
          bVar3 = auVar38._0_4_ < auVar6._0_4_;
          auVar8._16_48_ = auVar12;
          auVar8._0_16_ = auVar29;
          auVar7._4_60_ = auVar8._4_60_;
          auVar7._0_4_ = (float)((uint)bVar3 * (int)((fVar13 / fVar33) * 0.7853982) +
                                (uint)!bVar3 * auVar29._0_4_);
          local_378 = auVar7._0_16_;
          auVar9._16_48_ = auVar12;
          auVar9._0_16_ = auVar15;
          in_ZmmResult._4_60_ = auVar9._4_60_;
          in_ZmmResult._0_4_ = (uint)bVar3 * (int)fVar33 + (uint)!bVar3 * (int)fVar13;
          local_388 = in_ZmmResult._0_16_;
          fVar13 = cosf(auVar7._0_4_);
          local_368._0_4_ = fVar13;
          fVar13 = sinf((float)local_378._0_4_);
          auVar29 = ZEXT816(0) << 0x40;
          auVar38 = vinsertps_avx(ZEXT416((uint)((float)local_388._0_4_ * (float)local_368._0_4_)),
                                  ZEXT416((uint)((float)local_388._0_4_ * fVar13)),0x10);
        }
        auVar12 = in_ZmmResult._16_48_;
        auVar6 = vfnmadd213ss_fma(auVar38,auVar38,ZEXT416(0x3f800000));
        auVar15 = vmovshdup_avx(auVar38);
        fVar13 = auVar15._0_4_;
        auVar15 = vfnmadd231ss_fma(auVar6,auVar15,auVar15);
        auVar15 = vmaxss_avx(auVar15,auVar29);
        auVar15 = vsqrtss_avx(auVar15,auVar15);
        fVar33 = auVar15._0_4_ * 0.31830987;
        if ((fVar33 == 0.0) && (!NAN(fVar33))) {
          local_2e8 = ZEXT816(0) << 0x20;
          iVar5 = 1;
          local_2d8 = local_2e8;
          goto LAB_00450cbf;
        }
        local_388._0_4_ = fVar33;
      }
      else {
        auVar15 = vfnmadd213ss_fma(auVar38,auVar38,ZEXT416(0x3f800000));
        auVar29 = vmaxss_avx(auVar15,auVar29);
        auVar15 = vsqrtss_avx(auVar29,auVar29);
        auVar29 = vmovshdup_avx(auVar38);
        fVar13 = auVar29._0_4_ * 6.2831855;
        local_378._0_4_ = fVar13;
        local_368 = auVar38;
        local_388._0_4_ = auVar15._0_4_;
        fVar13 = cosf(fVar13);
        local_2c8 = ZEXT416((uint)(fVar13 * (float)local_388._0_4_));
        fVar13 = sinf((float)local_378._0_4_);
        fVar13 = fVar13 * (float)local_388._0_4_;
        auVar29 = ZEXT816(0) << 0x40;
        local_388._0_4_ = 0x3e22f983;
        auVar15 = local_368;
        auVar38 = local_2c8;
      }
      uVar14 = vcmpss_avx512f(auVar29,ZEXT416((uint)local_358._0_4_),0xe);
      bVar3 = (bool)((byte)uVar14 & 1);
      auVar6._8_4_ = 0x3f800000;
      auVar6._0_8_ = 0x3f8000003f800000;
      auVar6._12_4_ = 0x3f800000;
      auVar34._8_4_ = 0x80000000;
      auVar34._0_8_ = 0x8000000080000000;
      auVar34._12_4_ = 0x80000000;
      local_358 = vmovshdup_avx(local_348);
      fVar36 = local_358._0_4_;
      auVar11._16_48_ = auVar12;
      auVar11._0_16_ = local_338;
      auVar10._4_60_ = auVar11._4_60_;
      auVar10._0_4_ =
           (float)((uint)bVar3 * (local_338._0_4_ ^ 0x80000000) + (uint)!bVar3 * local_338._0_4_);
      local_338 = auVar10._0_16_;
      in_ZmmResult._0_16_ = vpternlogd_avx512vl(auVar6,local_338,auVar34,0xf8);
      in_ZmmResult._16_48_ = auVar12;
      fVar27 = in_ZmmResult._0_4_;
      fVar35 = local_348._0_4_;
      fVar32 = -1.0 / (auVar10._0_4_ + fVar27);
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)(fVar35 * fVar35 * fVar27)),ZEXT416((uint)fVar32),
                                auVar6);
      fVar33 = fVar35 * fVar36 * fVar32;
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)(fVar36 * fVar36)),ZEXT416((uint)fVar32),
                               in_ZmmResult._0_16_);
      fVar37 = auVar38._0_4_;
      fVar32 = auVar15._0_4_;
      local_398.z = (fVar37 * fVar35 * -fVar27 - fVar36 * fVar13) + auVar10._0_4_ * fVar32;
      auVar38 = vinsertps_avx(ZEXT416((uint)(fVar37 * auVar29._0_4_ + fVar33 * fVar13 +
                                            fVar35 * fVar32)),
                              ZEXT416((uint)(fVar37 * fVar27 * fVar33 + auVar6._0_4_ * fVar13 +
                                            fVar36 * fVar32)),0x10);
      local_398._0_8_ = vmovlps_avx(auVar38);
      Interaction::SpawnRay
                ((RayDifferential *)&local_288.__align,(Interaction *)local_178,
                 (Vector3f *)&local_398);
      auVar31 = ZEXT856(local_288._20_8_);
      auStack_2a8 = local_288._16_12_;
      local_2b8 = local_288.__align;
      fStack_2b0 = local_288._8_4_;
      local_2ac = local_288._12_4_;
      local_298.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_288._32_8_;
      tMax = this->maxDist;
      auVar26 = (undefined1  [56])0x0;
      *(long *)(in_FS_OFFSET + -0x378) = *(long *)(in_FS_OFFSET + -0x378) + 1;
      if (((this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate.
           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
           .bits & 0xffffffffffff) != 0) {
        auVar26 = (undefined1  [56])0x0;
        auVar31 = ZEXT856(local_288._20_8_);
        bVar3 = PrimitiveHandle::IntersectP(this_00,(Ray *)&local_2b8,tMax);
        iVar5 = 0;
        if (bVar3) goto LAB_00450cbf;
      }
      SVar39 = TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBSpectrum,pbrt::RGBReflectanceSpectrum,pbrt::BlackbodySpectrum>
               ::
               Dispatch<pbrt::SpectrumHandle::Sample(pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                         (local_320,(anon_class_8_1_5ef94505)lambda);
      auVar30._0_8_ = SVar39.values.values._8_8_;
      auVar30._8_56_ = auVar31;
      auVar24._0_8_ = SVar39.values.values._0_8_;
      auVar24._8_56_ = auVar26;
      auVar38 = vmovlhps_avx(auVar24._0_16_,auVar30._0_16_);
      iVar5 = 1;
      auVar15 = ZEXT416((uint)(local_338._0_4_ * local_398.z));
      auVar29 = vfmadd132ss_fma(local_358,auVar15,ZEXT416((uint)local_398.y));
      auVar15 = vfmsub213ss_fma(ZEXT416((uint)local_398.z),local_338,auVar15);
      auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar15._0_4_)),local_348,
                                ZEXT416((uint)local_398.x));
      fVar13 = auVar29._0_4_ / ((float)local_388._0_4_ * 3.1415927);
      local_2e8._0_4_ = fVar13 * auVar38._0_4_;
      local_2e8._4_4_ = fVar13 * auVar38._4_4_;
      local_2e8._8_4_ = fVar13 * auVar38._8_4_;
      local_2e8._12_4_ = fVar13 * auVar38._12_4_;
      local_2d8 = vshufpd_avx(local_2e8,local_2e8,1);
    }
LAB_00450cbf:
  } while (iVar5 == 2);
  uVar14 = 0;
  uVar28 = 0;
  if (iVar5 != 0) {
    uVar14 = local_2e8._0_8_;
    uVar28 = local_2d8._0_8_;
  }
LAB_00450d19:
  SVar39.values.values[2] = (float)(int)uVar28;
  SVar39.values.values[3] = (float)(int)((ulong)uVar28 >> 0x20);
  SVar39.values.values[0] = (float)(int)uVar14;
  SVar39.values.values[1] = (float)(int)((ulong)uVar14 >> 0x20);
  return (SampledSpectrum)SVar39.values.values;
}

Assistant:

SampledSpectrum AOIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f);

    // Intersect _ray_ with scene and store intersection in _isect_
    pstd::optional<ShapeIntersection> si;
retry:
    si = Intersect(ray);
    if (si) {
        SurfaceInteraction &isect = si->intr;
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            goto retry;
        }

        // Compute coordinate frame based on true geometry, not shading
        // geometry.
        Normal3f n = FaceForward(isect.n, -ray.d);
        Vector3f s = Normalize(isect.dpdu);
        Vector3f t = Cross(isect.n, s);

        Vector3f wi;
        Float pdf;
        Point2f u = sampler.Get2D();
        if (cosSample) {
            wi = SampleCosineHemisphere(u);
            pdf = CosineHemispherePDF(std::abs(wi.z));
        } else {
            wi = SampleUniformHemisphere(u);
            pdf = UniformHemispherePDF();
        }
        if (pdf == 0)
            return SampledSpectrum(0.);

        Frame f = Frame::FromZ(n);
        wi = f.FromLocal(wi);

        // Divide by pi so that fully visible is one.
        Ray r = isect.SpawnRay(wi);
        if (!IntersectP(r, maxDist))
            return illuminant.Sample(lambda) * SampledSpectrum(Dot(wi, n) / (Pi * pdf));
    }
    return SampledSpectrum(0.);
}